

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O3

void cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,(anonymous_namespace)::file_not_persistent>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *cont,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  iterator __first;
  
  pbVar5 = (cont->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (cont->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pbVar1 - (long)pbVar5;
  if (0 < lVar4 >> 7) {
    lVar3 = (lVar4 >> 7) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                        ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)pbVar5,param_2);
      __first._M_current = pbVar5;
      if (bVar2) goto LAB_0017c07c;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                        ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)(pbVar5 + 1),
                         param_2);
      __first._M_current = pbVar5 + 1;
      if (bVar2) goto LAB_0017c07c;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                        ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)(pbVar5 + 2),
                         param_2);
      __first._M_current = pbVar5 + 2;
      if (bVar2) goto LAB_0017c07c;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                        ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)(pbVar5 + 3),
                         param_2);
      __first._M_current = pbVar5 + 3;
      if (bVar2) goto LAB_0017c07c;
      pbVar5 = pbVar5 + 4;
      lVar3 = lVar3 + -1;
      lVar4 = lVar4 + -0x80;
    } while (1 < lVar3);
  }
  lVar4 = lVar4 >> 5;
  if (lVar4 == 1) {
LAB_0017c06b:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                      ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)pbVar5,param_2);
    __first._M_current = pbVar5;
    if (!bVar2) {
      __first._M_current = pbVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_0017c05b:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                      ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)pbVar5,param_2);
    __first._M_current = pbVar5;
    if (!bVar2) {
      pbVar5 = pbVar5 + 1;
      goto LAB_0017c06b;
    }
  }
  else {
    __first._M_current = pbVar1;
    if (lVar4 != 3) goto LAB_0017c0b9;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                      ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)pbVar5,param_2);
    __first._M_current = pbVar5;
    if (!bVar2) {
      pbVar5 = pbVar5 + 1;
      goto LAB_0017c05b;
    }
  }
LAB_0017c07c:
  pbVar5 = __first._M_current + 1;
  if (pbVar5 != pbVar1 && __first._M_current != pbVar1) {
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                        ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)pbVar5,param_2);
      if (!bVar2) {
        param_2._M_current = pbVar5;
        std::__cxx11::string::operator=((string *)__first._M_current,(string *)pbVar5);
        __first._M_current = __first._M_current + 1;
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
LAB_0017c0b9:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(cont,__first,
             (cont->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void cmEraseIf(Container& cont, Predicate pred)
{
  cont.erase(std::remove_if(cont.begin(), cont.end(), pred), cont.end());
}